

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O2

double Imath_2_5::anon_unknown_18::maxOffDiag<double>(Matrix44<double> *A)

{
  int i;
  long lVar1;
  int j;
  long lVar2;
  double dVar3;
  double dVar4;
  
  dVar3 = 0.0;
  for (lVar1 = 0; lVar1 != 4; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
      dVar4 = dVar3;
      if ((lVar1 != lVar2) &&
         (dVar4 = ABS((*(double (*) [4])*(double (*) [4])A)[lVar2]), dVar4 <= dVar3)) {
        dVar4 = dVar3;
      }
      dVar3 = dVar4;
    }
    A = (Matrix44<double> *)((long)A + 0x20);
  }
  return dVar3;
}

Assistant:

T
maxOffDiag (const IMATH_INTERNAL_NAMESPACE::Matrix44<T>& A)
{
    T result = 0;
    for (int i = 0; i < 4; ++i)
    {
        for (int j = 0; j < 4; ++j)
        {
            if (i != j)
                result = std::max (result, std::abs (A[i][j]));
        }
    }

    return result;
}